

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode Curl_GetFTPResponse(Curl_easy *data,ssize_t *nreadp,int *ftpcode)

{
  anon_union_280_10_9f9d5394_for_proto *pp;
  dynbuf *s;
  curl_socket_t readfd0;
  connectdata *pcVar1;
  curl_trc_feat *pcVar2;
  _Bool _Var3;
  int iVar4;
  CURLcode CVar5;
  ulong uVar6;
  size_t sVar7;
  uint *puVar8;
  curl_socket_t writefd;
  size_t *in_R8;
  int iVar9;
  int value_to_be_ignored;
  size_t nread;
  undefined1 local_44 [20];
  
  pcVar1 = data->conn;
  readfd0 = pcVar1->sock[0];
  local_44._0_4_ = 0;
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)) &&
      (0 < Curl_trc_feat_ftp.log_level)))) {
    Curl_trc_ftp(data,"getFTPResponse start");
  }
  if (ftpcode == (int *)0x0) {
    ftpcode = (int *)local_44;
  }
  else {
    *ftpcode = 0;
  }
  pp = &pcVar1->proto;
  *nreadp = 0;
  s = &(pcVar1->proto).ftpc.pp.recvbuf;
  iVar9 = 0;
  local_44._12_8_ = pcVar1;
  do {
    uVar6 = Curl_pp_state_timeout(data,&(pp->ftpc).pp,false);
    if ((long)uVar6 < 1) {
      Curl_failf(data,"FTP response timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    if (999 < uVar6) {
      uVar6 = 1000;
    }
    sVar7 = Curl_dyn_len(s);
    if (((sVar7 != 0) && (iVar9 < 2)) || (_Var3 = Curl_conn_data_pending(data,0), _Var3)) {
LAB_00128cf8:
      _Var3 = Curl_pp_needs_flush(data,&(pp->ftpc).pp);
      if (((_Var3) && (CVar5 = Curl_pp_flushsend(data,&(pp->ftpc).pp), CVar5 != CURLE_OK)) ||
         (CVar5 = ftp_readresp(data,(int)pp,(pingpong *)ftpcode,(int *)(local_44 + 4),in_R8),
         CVar5 != CURLE_OK)) {
        uVar6 = (ulong)CVar5;
        goto LAB_00128da3;
      }
      iVar4 = 0;
      if (local_44._4_8_ == 0) {
        sVar7 = Curl_dyn_len(s);
        iVar4 = iVar9 + 1;
        if (sVar7 == 0) {
          iVar4 = 0;
        }
      }
      *nreadp = *nreadp + local_44._4_8_;
      iVar9 = iVar4;
    }
    else {
      _Var3 = Curl_pp_needs_flush(data,&(pp->ftpc).pp);
      writefd = -1;
      if (_Var3) {
        writefd = readfd0;
      }
      iVar4 = Curl_socket_check(readfd0,-1,writefd,uVar6);
      if (iVar4 < 0) {
        puVar8 = (uint *)__errno_location();
        Curl_failf(data,"FTP response aborted due to select/poll error: %d",(ulong)*puVar8);
        return CURLE_RECV_ERROR;
      }
      if (iVar4 != 0) goto LAB_00128cf8;
      iVar4 = Curl_pgrsUpdate(data);
      if (iVar4 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    if ((int)((pingpong *)ftpcode)->nread_resp != 0) {
      uVar6 = 0;
LAB_00128da3:
      *(undefined1 *)((long)(local_44._12_8_ + 0x440) + 8) = 0;
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
          && (0 < Curl_trc_feat_ftp.log_level)))) {
        Curl_trc_ftp(data,"getFTPResponse -> result=%d, nread=%zd, ftpcode=%d",uVar6,*nreadp,
                     (ulong)(uint)((pingpong *)ftpcode)->nread_resp);
      }
      return (CURLcode)uVar6;
    }
  } while( true );
}

Assistant:

CURLcode Curl_GetFTPResponse(struct Curl_easy *data,
                             ssize_t *nreadp, /* return number of bytes read */
                             int *ftpcode) /* return the ftp-code */
{
  /*
   * We cannot read just one byte per read() and then go back to select() as
   * the OpenSSL read() does not grok that properly.
   *
   * Alas, read as much as possible, split up into lines, use the ending
   * line in a response or continue reading.  */

  struct connectdata *conn = data->conn;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  size_t nread;
  int cache_skip = 0;
  int value_to_be_ignored = 0;

  CURL_TRC_FTP(data, "getFTPResponse start");

  if(ftpcode)
    *ftpcode = 0; /* 0 for errors */
  else
    /* make the pointer point to something for the rest of this function */
    ftpcode = &value_to_be_ignored;

  *nreadp = 0;

  while(!*ftpcode && !result) {
    /* check and reset timeout value every lap */
    timediff_t timeout = Curl_pp_state_timeout(data, pp, FALSE);
    timediff_t interval_ms;

    if(timeout <= 0) {
      failf(data, "FTP response timeout");
      return CURLE_OPERATION_TIMEDOUT; /* already too little time */
    }

    interval_ms = 1000;  /* use 1 second timeout intervals */
    if(timeout < interval_ms)
      interval_ms = timeout;

    /*
     * Since this function is blocking, we need to wait here for input on the
     * connection and only then we call the response reading function. We do
     * timeout at least every second to make the timeout check run.
     *
     * A caution here is that the ftp_readresp() function has a cache that may
     * contain pieces of a response from the previous invoke and we need to
     * make sure we do not just wait for input while there is unhandled data in
     * that cache. But also, if the cache is there, we call ftp_readresp() and
     * the cache was not good enough to continue we must not just busy-loop
     * around this function.
     *
     */

    if(Curl_dyn_len(&pp->recvbuf) && (cache_skip < 2)) {
      /*
       * There is a cache left since before. We then skipping the wait for
       * socket action, unless this is the same cache like the previous round
       * as then the cache was deemed not enough to act on and we then need to
       * wait for more data anyway.
       */
    }
    else if(!Curl_conn_data_pending(data, FIRSTSOCKET)) {
      curl_socket_t wsock = Curl_pp_needs_flush(data, pp) ?
        sockfd : CURL_SOCKET_BAD;
      int ev = Curl_socket_check(sockfd, CURL_SOCKET_BAD, wsock, interval_ms);
      if(ev < 0) {
        failf(data, "FTP response aborted due to select/poll error: %d",
              SOCKERRNO);
        return CURLE_RECV_ERROR;
      }
      else if(ev == 0) {
        if(Curl_pgrsUpdate(data))
          return CURLE_ABORTED_BY_CALLBACK;
        continue; /* just continue in our loop for the timeout duration */
      }
    }

    if(Curl_pp_needs_flush(data, pp)) {
      result = Curl_pp_flushsend(data, pp);
      if(result)
        break;
    }

    result = ftp_readresp(data, FIRSTSOCKET, pp, ftpcode, &nread);
    if(result)
      break;

    if(!nread && Curl_dyn_len(&pp->recvbuf))
      /* bump cache skip counter as on repeated skips we must wait for more
         data */
      cache_skip++;
    else
      /* when we got data or there is no cache left, we reset the cache skip
         counter */
      cache_skip = 0;

    *nreadp += nread;

  } /* while there is buffer left and loop is requested */

  pp->pending_resp = FALSE;
  CURL_TRC_FTP(data, "getFTPResponse -> result=%d, nread=%zd, ftpcode=%d",
               result, *nreadp, *ftpcode);

  return result;
}